

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O2

BufferResult __thiscall
tonk::UDPSocket::onUnrecognizedSource
          (UDPSocket *this,UDPAddress *addr,uint64_t receiveUsec,DatagramBuffer datagram)

{
  atomic<int> *paVar1;
  byte bVar2;
  element_type *peVar3;
  strand_service *psVar4;
  BufferAllocator *pBVar5;
  Channel *pCVar6;
  ConnectionIdMap *pCVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  HandshakeType HVar12;
  uint32_t uVar13;
  Connection *pCVar14;
  func_type p_Var15;
  OutputWorker *pOVar16;
  uint64_t uVar17;
  tonk *this_00;
  uint64_t value;
  uint64_t value_00;
  uint uVar18;
  ulong uVar19;
  uint8_t *data;
  string local_1f0;
  tonk *local_1d0;
  scheduler_operation *local_1c8;
  UDPAddress *local_1c0;
  Locker locker;
  ostringstream aoStack_1a8 [32];
  scheduler_operation *psStack_188;
  func_type p_Stack_180;
  BufferAllocator *pBStack_178;
  scheduler_operation *psStack_170;
  BufferAllocator *local_168;
  
  uVar19 = (ulong)datagram.Bytes;
  bVar2 = datagram.Data[uVar19 - 3];
  if ((char)bVar2 < '\0') {
    if ((bVar2 & 0x40) == 0) {
      pCVar6 = (this->Deps).Logger;
      if ((int)pCVar6->ChannelMinLevel < 4) {
        locker.TheLock = (Lock *)pCVar6->ChannelName;
        std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
        std::operator<<((ostream *)aoStack_1a8,(string *)&pCVar6->Prefix);
        std::operator<<((ostream *)aoStack_1a8,
                        "Ignoring non-handshake packet from unrecognized source (bytes = ");
        std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
        std::operator<<((ostream *)aoStack_1a8,")");
        pOVar16 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar16,(LogStringBuffer *)&locker);
        std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
      }
      local_1f0._M_dataplus._M_p = (pointer)&locker;
      LOCK();
      paVar1 = &((this->Deps).SocketRefCount)->RefCount;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      p_Var15 = *(func_type *)&(addr->impl_).data_;
      uVar9 = *(undefined8 *)((long)&(addr->impl_).data_ + 8);
      uVar10 = *(undefined8 *)((long)&(addr->impl_).data_ + 0x14);
      peVar3 = (this->AsioConnectStrand).
               super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      aoStack_1a8._8_4_ =
           (undefined4)((ulong)*(undefined8 *)((long)&(addr->impl_).data_ + 0xc) >> 0x20);
      aoStack_1a8._12_4_ = (undefined4)uVar10;
      aoStack_1a8._16_4_ = (undefined4)((ulong)uVar10 >> 0x20);
      aoStack_1a8._0_4_ = (undefined4)uVar9;
      aoStack_1a8._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
      psVar4 = peVar3->service_;
      locker.TheLock = (Lock *)this;
      local_1f0._M_string_length =
           (size_type)asio::asio_handler_allocate(0x40,local_1f0._M_dataplus._M_p);
      ((operation *)local_1f0._M_string_length)->next_ = (scheduler_operation *)0x0;
      ((operation *)local_1f0._M_string_length)->func_ =
           asio::detail::
           completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:629:33)>
           ::do_complete;
      ((operation *)local_1f0._M_string_length)->task_result_ = 0;
      ((operation *)(local_1f0._M_string_length + 0x18))->next_ =
           (scheduler_operation *)locker.TheLock;
      *(ulong *)&((operation *)(local_1f0._M_string_length + 0x18))->field_0x14 =
           CONCAT44(aoStack_1a8._8_4_,aoStack_1a8._4_4_);
      *(ulong *)((long)&((operation *)(local_1f0._M_string_length + 0x30))->next_ + 4) =
           CONCAT44(aoStack_1a8._16_4_,aoStack_1a8._12_4_);
      ((operation *)(local_1f0._M_string_length + 0x18))->func_ = p_Var15;
      *(ulong *)&((operation *)(local_1f0._M_string_length + 0x18))->task_result_ =
           CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_);
      local_1f0.field_2._M_allocated_capacity = local_1f0._M_string_length;
      asio::detail::strand_service::do_post
                (psVar4,&peVar3->impl_,(operation *)local_1f0._M_string_length,false);
      local_1f0._M_string_length = 0;
      local_1f0.field_2._M_allocated_capacity = 0;
      asio::detail::
      completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:629:33)>
      ::ptr::reset((ptr *)&local_1f0);
      return Free;
    }
    data = datagram.Data + (uVar19 - 0x12);
    local_1c8 = (scheduler_operation *)receiveUsec;
    local_1c0 = addr;
    HVar12 = protocol::handshake::GetType(data);
    if (HVar12 != HandshakeType_Peer2PeerConnect) {
      if (HVar12 == HandshakeType_C2SUpdateSourceAddress) {
        uVar13 = protocol::handshake::GetConnectionId(data);
        uVar17 = protocol::handshake::GetKey(data);
        pCVar7 = (this->Deps).IdMap;
        local_1d0 = (tonk *)CONCAT44(local_1d0._4_4_,uVar13);
        local_1f0._M_dataplus._M_p._0_4_ = uVar13;
        locker.TheLock = &pCVar7->IdLock;
        std::recursive_mutex::lock(&(locker.TheLock)->cs);
        uVar18 = LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::find_index
                           (&(pCVar7->IdMap).TheMap,(uint *)&local_1f0);
        bVar8 = true;
        if (((int)uVar18 < 0) ||
           (pCVar14 = *(Connection **)((pCVar7->IdMap).TheMap.m_values[uVar18].m_bits + 8),
           pCVar14 == (Connection *)0x0)) {
          pCVar14 = (Connection *)0x0;
        }
        else {
          LOCK();
          paVar1 = &(pCVar14->super_IConnection).SelfRefCount.RefCount;
          (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
          UNLOCK();
          bVar8 = false;
        }
        Locker::~Locker(&locker);
        if (!bVar8) {
          if (pCVar14->EncryptionKey == uVar17) {
            pBVar5 = (this->Deps).ReadBufferAllocator;
            locker.TheLock = &pBVar5->AllocatorLock;
            std::recursive_mutex::lock((recursive_mutex *)pBVar5);
            pktalloc::Allocator::Shrink(&pBVar5->Allocator,datagram.Data,datagram.Bytes);
            Locker::~Locker(&locker);
            pCVar6 = (this->Deps).Logger;
            if ((int)pCVar6->ChannelMinLevel < 4) {
              locker.TheLock = (Lock *)pCVar6->ChannelName;
              std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
              std::operator<<((ostream *)aoStack_1a8,(string *)&pCVar6->Prefix);
              std::operator<<((ostream *)aoStack_1a8,"Switching connection address for ID ");
              std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
              pOVar16 = logger::OutputWorker::GetInstance();
              logger::OutputWorker::Write(pOVar16,(LogStringBuffer *)&locker);
              std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
            }
            LOCK();
            (pCVar14->PeerAddressChangesAllowed)._M_base._M_i = true;
            UNLOCK();
            Connection::OnUDPDatagram(pCVar14,(uint64_t)local_1c8,local_1c0,datagram);
            return InUse;
          }
          LOCK();
          paVar1 = &(pCVar14->super_IConnection).SelfRefCount.RefCount;
          (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
          UNLOCK();
        }
        pCVar6 = (this->Deps).Logger;
        if (3 < (int)pCVar6->ChannelMinLevel) {
          return Free;
        }
        locker.TheLock = (Lock *)pCVar6->ChannelName;
        std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
        std::operator<<((ostream *)aoStack_1a8,(string *)&pCVar6->Prefix);
        std::operator<<((ostream *)aoStack_1a8,"Reconnect failed: Unrecognized ID ");
        std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
        pOVar16 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar16,(LogStringBuffer *)&locker);
      }
      else {
        if (HVar12 == HandshakeType_C2SConnectionRequest) {
          pBVar5 = (this->Deps).ReadBufferAllocator;
          locker.TheLock = &pBVar5->AllocatorLock;
          std::recursive_mutex::lock((recursive_mutex *)pBVar5);
          pktalloc::Allocator::Shrink(&pBVar5->Allocator,datagram.Data,datagram.Bytes);
          Locker::~Locker(&locker);
          p_Var15 = (func_type)protocol::handshake::GetKey(data);
          LOCK();
          paVar1 = &((this->Deps).SocketRefCount)->RefCount;
          (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
          UNLOCK();
          peVar3 = (this->AsioConnectStrand).
                   super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar9 = *(undefined8 *)((long)&(local_1c0->impl_).data_ + 0x14);
          uVar10 = *(undefined8 *)&(local_1c0->impl_).data_;
          uVar11 = *(undefined8 *)((long)&(local_1c0->impl_).data_ + 8);
          aoStack_1a8._16_4_ =
               (undefined4)((ulong)*(undefined8 *)((long)&(local_1c0->impl_).data_ + 0xc) >> 0x20);
          aoStack_1a8._20_4_ = (undefined4)uVar9;
          aoStack_1a8._24_4_ = (undefined4)((ulong)uVar9 >> 0x20);
          aoStack_1a8._0_4_ = (undefined4)uVar10;
          aoStack_1a8._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
          aoStack_1a8._8_4_ = (undefined4)uVar11;
          aoStack_1a8._12_4_ = (undefined4)((ulong)uVar11 >> 0x20);
          p_Stack_180 = (func_type)datagram.Data;
          psStack_170 = (scheduler_operation *)datagram.FreePtr;
          local_168 = datagram.AllocatorForFree;
          psStack_188 = local_1c8;
          psVar4 = peVar3->service_;
          local_1f0._M_dataplus._M_p = (pointer)&locker;
          locker.TheLock = (Lock *)this;
          pBStack_178 = (BufferAllocator *)datagram._8_8_;
          local_1f0._M_string_length = (size_type)asio::asio_handler_allocate(0x70,&locker);
          ((operation *)local_1f0._M_string_length)->next_ = (scheduler_operation *)0x0;
          ((operation *)local_1f0._M_string_length)->func_ =
               asio::detail::
               completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:664:33)>
               ::do_complete;
          ((operation *)local_1f0._M_string_length)->task_result_ = 0;
          ((operation *)(local_1f0._M_string_length + 0x18))->next_ =
               (scheduler_operation *)locker.TheLock;
          ((operation *)(local_1f0._M_string_length + 0x18))->func_ = p_Var15;
          *(ulong *)&((operation *)(local_1f0._M_string_length + 0x18))->task_result_ =
               CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_);
          ((operation *)(local_1f0._M_string_length + 0x30))->next_ =
               (scheduler_operation *)CONCAT44(aoStack_1a8._12_4_,aoStack_1a8._8_4_);
          *(ulong *)((long)&((operation *)(local_1f0._M_string_length + 0x30))->next_ + 4) =
               CONCAT44(aoStack_1a8._16_4_,aoStack_1a8._12_4_);
          *(ulong *)((long)&((operation *)(local_1f0._M_string_length + 0x30))->func_ + 4) =
               CONCAT44(aoStack_1a8._24_4_,aoStack_1a8._20_4_);
          ((operation *)(local_1f0._M_string_length + 0x48))->next_ = psStack_188;
          ((operation *)(local_1f0._M_string_length + 0x48))->func_ = p_Stack_180;
          *(BufferAllocator **)&((operation *)(local_1f0._M_string_length + 0x48))->task_result_ =
               pBStack_178;
          ((operation *)(local_1f0._M_string_length + 0x60))->next_ = psStack_170;
          ((operation *)(local_1f0._M_string_length + 0x60))->func_ = (func_type)local_168;
          local_1f0.field_2._M_allocated_capacity = local_1f0._M_string_length;
          asio::detail::strand_service::do_post
                    (psVar4,&peVar3->impl_,(operation *)local_1f0._M_string_length,false);
          local_1f0._M_string_length = 0;
          local_1f0.field_2._M_allocated_capacity = 0;
          asio::detail::
          completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:664:33)>
          ::ptr::reset((ptr *)&local_1f0);
          return InUse;
        }
        pCVar6 = (this->Deps).Logger;
        if (3 < (int)pCVar6->ChannelMinLevel) {
          return Free;
        }
        locker.TheLock = (Lock *)pCVar6->ChannelName;
        std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
        std::operator<<((ostream *)aoStack_1a8,(string *)&pCVar6->Prefix);
        std::operator<<((ostream *)aoStack_1a8,"Unrecognized handshake type");
        pOVar16 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar16,(LogStringBuffer *)&locker);
      }
      goto LAB_0012b538;
    }
    this_00 = (tonk *)protocol::handshake::GetKey(data);
    pCVar14 = (Connection *)P2PConnectionKeyMap::FindByKey((this->Deps).P2PKeyMap,(key_t)this_00);
    if (pCVar14 != (Connection *)0x0) {
      pBVar5 = (this->Deps).ReadBufferAllocator;
      local_1d0 = this_00;
      locker.TheLock = &pBVar5->AllocatorLock;
      std::recursive_mutex::lock((recursive_mutex *)pBVar5);
      pktalloc::Allocator::Shrink(&pBVar5->Allocator,datagram.Data,datagram.Bytes);
      Locker::~Locker(&locker);
      Connection::OnP2PConnection
                (pCVar14,(uint64_t)local_1c8,local_1c0,datagram,(uint64_t)local_1d0,
                 &this->AddressMap,&this->super_IUDPSender);
      return InUse;
    }
    pCVar6 = (this->Deps).Logger;
    HexString_abi_cxx11_(&local_1f0,this_00,value_00);
    if (3 < (int)pCVar6->ChannelMinLevel) goto LAB_0012b71e;
    locker.TheLock = (Lock *)pCVar6->ChannelName;
    std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
    std::operator<<((ostream *)aoStack_1a8,(string *)&pCVar6->Prefix);
    std::operator<<((ostream *)aoStack_1a8,"Peer2Peer connection with unrecognized key = ");
    std::operator<<((ostream *)aoStack_1a8,(string *)&local_1f0);
    pOVar16 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar16,(LogStringBuffer *)&locker);
  }
  else {
    if ((datagram.Bytes != 5) || (bVar2 != 1)) {
      if ((6 < datagram.Bytes) &&
         ((bVar2 == 0 && (*(int *)(datagram.Data + (uVar19 - 7)) == 0x4b6e6f54)))) {
        if (this->SocketConfig->OnAdvertisement ==
            (_func_void_TonkAppContextPtr_TonkSocket_char_ptr_uint16_t_uint8_t_ptr_uint32_t *)0x0) {
          return Free;
        }
        local_1f0._M_dataplus._M_p = (pointer)&locker;
        LOCK();
        paVar1 = &((this->Deps).SocketRefCount)->RefCount;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        uVar9 = *(undefined8 *)((long)&(addr->impl_).data_ + 0x14);
        peVar3 = (this->AsioConnectStrand).
                 super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var15 = *(func_type *)&(addr->impl_).data_;
        uVar10 = *(undefined8 *)((long)&(addr->impl_).data_ + 8);
        aoStack_1a8._8_4_ =
             (undefined4)((ulong)*(undefined8 *)((long)&(addr->impl_).data_ + 0xc) >> 0x20);
        aoStack_1a8._12_4_ = (undefined4)uVar9;
        aoStack_1a8._16_4_ = (undefined4)((ulong)uVar9 >> 0x20);
        aoStack_1a8._0_4_ = (undefined4)uVar10;
        aoStack_1a8._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
        aoStack_1a8._24_4_ = datagram.Data._0_4_;
        aoStack_1a8._28_4_ = datagram.Data._4_4_;
        p_Stack_180 = (func_type)datagram.FreePtr;
        pBStack_178 = datagram.AllocatorForFree;
        psVar4 = peVar3->service_;
        locker.TheLock = (Lock *)this;
        psStack_188 = datagram._8_8_;
        local_1f0._M_string_length =
             (size_type)asio::asio_handler_allocate(0x60,local_1f0._M_dataplus._M_p);
        ((operation *)local_1f0._M_string_length)->next_ = (scheduler_operation *)0x0;
        ((operation *)local_1f0._M_string_length)->func_ =
             asio::detail::
             completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:595:37)>
             ::do_complete;
        ((operation *)local_1f0._M_string_length)->task_result_ = 0;
        ((operation *)(local_1f0._M_string_length + 0x18))->next_ =
             (scheduler_operation *)locker.TheLock;
        *(ulong *)&((operation *)(local_1f0._M_string_length + 0x18))->field_0x14 =
             CONCAT44(aoStack_1a8._8_4_,aoStack_1a8._4_4_);
        *(ulong *)((long)&((operation *)(local_1f0._M_string_length + 0x30))->next_ + 4) =
             CONCAT44(aoStack_1a8._16_4_,aoStack_1a8._12_4_);
        ((operation *)(local_1f0._M_string_length + 0x18))->func_ = p_Var15;
        *(ulong *)&((operation *)(local_1f0._M_string_length + 0x18))->task_result_ =
             CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_);
        *(ulong *)&((operation *)(local_1f0._M_string_length + 0x30))->task_result_ =
             CONCAT44(aoStack_1a8._28_4_,aoStack_1a8._24_4_);
        ((operation *)(local_1f0._M_string_length + 0x48))->next_ = psStack_188;
        ((operation *)(local_1f0._M_string_length + 0x48))->func_ = p_Stack_180;
        *(BufferAllocator **)&((operation *)(local_1f0._M_string_length + 0x48))->task_result_ =
             pBStack_178;
        local_1f0.field_2._M_allocated_capacity = local_1f0._M_string_length;
        asio::detail::strand_service::do_post
                  (psVar4,&peVar3->impl_,(operation *)local_1f0._M_string_length,false);
        local_1f0._M_string_length = 0;
        local_1f0.field_2._M_allocated_capacity = 0;
        asio::detail::
        completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:595:37)>
        ::ptr::reset((ptr *)&local_1f0);
        return InUse;
      }
      pCVar6 = (this->Deps).Logger;
      if (3 < (int)pCVar6->ChannelMinLevel) {
        return Free;
      }
      locker.TheLock = (Lock *)pCVar6->ChannelName;
      std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
      std::operator<<((ostream *)aoStack_1a8,(string *)&pCVar6->Prefix);
      std::operator<<((ostream *)aoStack_1a8,"Ignoring unexpected unconnected type ");
      std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
      std::operator<<((ostream *)aoStack_1a8," from unrecognized source (bytes = ");
      std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
      std::operator<<((ostream *)aoStack_1a8,")");
      pOVar16 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar16,(LogStringBuffer *)&locker);
LAB_0012b538:
      std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
      return Free;
    }
    uVar18 = CONCAT22(*(undefined2 *)(datagram.Data + (uVar19 - 5)),
                      *(undefined2 *)(datagram.Data + (uVar19 - 2)));
    pCVar14 = (Connection *)P2PConnectionKeyMap::FindByKey((this->Deps).P2PKeyMap,uVar18);
    if (pCVar14 != (Connection *)0x0) {
      Connection::OnNATProbe(pCVar14,addr,uVar18,&this->AddressMap,&this->super_IUDPSender);
      return Free;
    }
    pCVar6 = (this->Deps).Logger;
    HexString_abi_cxx11_(&local_1f0,(tonk *)(ulong)uVar18,value);
    if (3 < (int)pCVar6->ChannelMinLevel) goto LAB_0012b71e;
    locker.TheLock = (Lock *)pCVar6->ChannelName;
    std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
    std::operator<<((ostream *)aoStack_1a8,(string *)&pCVar6->Prefix);
    std::operator<<((ostream *)aoStack_1a8,"NAT probe received with key = ");
    std::operator<<((ostream *)aoStack_1a8,(string *)&local_1f0);
    std::operator<<((ostream *)aoStack_1a8," not found in map");
    pOVar16 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar16,(LogStringBuffer *)&locker);
  }
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
LAB_0012b71e:
  std::__cxx11::string::~string((string *)&local_1f0);
  return Free;
}

Assistant:

UDPSocket::BufferResult UDPSocket::onUnrecognizedSource(
    const UDPAddress& addr,
    const uint64_t receiveUsec,
    DatagramBuffer datagram)
{
    /*
        Footer protocol:
            ...
            [Handshake (12 bytes)]
            <Timestamp (3 bytes)>
            <Flags (1 byte)>
            <Encryption Tag (2 bytes)>
    */
    const uint8_t* footer = datagram.Data + datagram.Bytes - protocol::kEncryptionTagBytes - protocol::kFlagsBytes;
    protocol::FlagsReader flags(footer[0]);

    // If this is an unconnected datagram:
    if (!flags.IsConnectionDatagram())
    {
        const unsigned unconnectedType = flags.GetUnconnectedType();

        // If this is a NAT probe:
        if (protocol::Unconnected_P2PNATProbe == unconnectedType &&
            protocol::kNATProbeBytes == datagram.Bytes)
        {
            uint32_t key = siamese::ReadU16_LE(footer - 2);
            key = (key << 16) | siamese::ReadU16_LE(footer + 1);

            // If there is a NAT probe in progress:
            IConnection* icon = Deps.P2PKeyMap->FindByKey(key);
            // Note the connection reference count was incremented by FindByKey()
            if (icon) {
                Connection* connection = reinterpret_cast<Connection*>(icon);
                connection->OnNATProbe(addr, key, &AddressMap, this);
            }
            else {
                Deps.Logger->Warning("NAT probe received with key = ", HexString(key), " not found in map");
            }

            return BufferResult::Free;
        }

        // If this is an advertisement
        if (protocol::Unconnected_Advertisement == unconnectedType &&
            protocol::kAdvertisementOverheadBytes <= datagram.Bytes &&
            protocol::kMagicAdvertisement == siamese::ReadU32_LE(footer - 4))
        {
            // If the application is not requesting advertisements, skip the async work
            if (!SocketConfig->OnAdvertisement) {
                return BufferResult::Free;
            }

            // Run callback in the connect strand to avoid blocking datagram processing
            Deps.SocketRefCount->IncrementReferences();
            AsioConnectStrand->post([this, addr, datagram]()
            {
                std::string ipString = addr.address().to_string();

                // Convert IP address to string and pass to app with data
                SocketConfig->OnAdvertisement(
                    SocketConfig->AppContextPtr,
                    APITonkSocket,
                    ipString.c_str(),
                    addr.port(),
                    datagram.Data,
                    datagram.Bytes - protocol::kAdvertisementOverheadBytes);

                datagram.Free();

                Deps.SocketRefCount->DecrementReferences();
            });

            return BufferResult::InUse;
        }

        // Unexpected type from unrecognized source
        Deps.Logger->Warning("Ignoring unexpected unconnected type ", unconnectedType, " from unrecognized source (bytes = ", datagram.Bytes, ")");

        return BufferResult::Free;
    }

    const unsigned handshakeBytes = flags.HandshakeBytes();
    if (handshakeBytes <= 0)
    {
        // Non-handshake from unrecognized source
        Deps.Logger->Warning("Ignoring non-handshake packet from unrecognized source (bytes = ", datagram.Bytes, ")");

        Deps.SocketRefCount->IncrementReferences();
        AsioConnectStrand->post([this, addr]()
        {
            DatagramBuffer datagram;
            datagram.AllocatorForFree = Deps.ReadBufferAllocator;
            datagram.Bytes = protocol::kS2CUnknownSourceBytes;
            datagram.Data = Deps.ReadBufferAllocator->Allocate(protocol::kS2CUnknownSourceBytes);
            datagram.FreePtr = datagram.Data;

            if (datagram.Data)
            {
                protocol::GenerateS2CUnknownSource(datagram.Data);
                Send(addr, datagram, Deps.SocketRefCount);
            }

            Deps.SocketRefCount->DecrementReferences();
        });

        return BufferResult::Free;
    }

    // Get pointer to the handshake data
    const uint8_t* handshakeData = footer - handshakeBytes - protocol::kTimestampBytes;

    // Decode handshake type
    const protocol::HandshakeType handshakeType = protocol::handshake::GetType(handshakeData);

    // If this is a connection request datagram:
    if (handshakeType == protocol::HandshakeType_C2SConnectionRequest)
    {
        // Shrink the datagram buffer before passing to connection
        Deps.ReadBufferAllocator->Shrink(datagram.Data, datagram.Bytes);

        const uint64_t key = protocol::handshake::GetKey(handshakeData);

        Deps.SocketRefCount->IncrementReferences();
        AsioConnectStrand->post([this, key, addr, receiveUsec, datagram]()
        {
            onConnectRequest(key, addr, receiveUsec, datagram);
            Deps.SocketRefCount->DecrementReferences();
        });

        return BufferResult::InUse;
    }

    // If this is a peer2peer connection request:
    if (handshakeType == protocol::HandshakeType_Peer2PeerConnect)
    {
        const uint64_t key = protocol::handshake::GetKey(handshakeData);

        // Note: The P2PKeyMap should match the low 4 bytes of the encryption key
        const uint32_t connKey = static_cast<uint32_t>(key);

        IConnection* icon = Deps.P2PKeyMap->FindByKey(connKey);
        // Note the connection reference count was incremented by FindByKey()

        // If there is a NAT probe in progress:
        if (icon)
        {
            // Shrink the datagram buffer before passing to connection
            Deps.ReadBufferAllocator->Shrink(datagram.Data, datagram.Bytes);

            Connection* connection = reinterpret_cast<Connection*>(icon);
            connection->OnP2PConnection(
                receiveUsec,
                addr,
                datagram,
                key,
                &AddressMap,
                this);
            return BufferResult::InUse;
        }

        Deps.Logger->Warning("Peer2Peer connection with unrecognized key = ", HexString(key));

        // Unrecognized connection request
        return BufferResult::Free;
    }

    // If this handshake is updating a source address:
    if (handshakeType == protocol::HandshakeType_C2SUpdateSourceAddress)
    {
        const uint32_t id = protocol::handshake::GetConnectionId(handshakeData);
        const uint64_t key = protocol::handshake::GetKey(handshakeData);

        IConnection* icon = Deps.IdMap->FindById(id);
        // Note the connection reference count was incremented by FindById()
        if (icon)
        {
            Connection* connection = reinterpret_cast<Connection*>(icon);
            if (connection->GetEncryptionKey() == key)
            {
                // Shrink the datagram buffer before passing to connection
                Deps.ReadBufferAllocator->Shrink(datagram.Data, datagram.Bytes);

                Deps.Logger->Warning("Switching connection address for ID ", id);

                connection->PeerAddressChangesAllowed = true;

                connection->OnUDPDatagram(receiveUsec, addr, datagram);
                return BufferResult::InUse;
            }

            // FindById() has incremented the reference count, so decrement it here
            connection->SelfRefCount.DecrementReferences();
        }

        Deps.Logger->Warning("Reconnect failed: Unrecognized ID ", id);
        return BufferResult::Free;
    }

    // Not a handshake:
    Deps.Logger->Warning("Unrecognized handshake type");
    return BufferResult::Free;
}